

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase123::run(TestCase123 *this)

{
  size_t sVar1;
  Builder builder_00;
  Builder builder_01;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<capnp::word> firstSegment;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  word *local_42b0;
  Builder local_42a8;
  Builder local_4280;
  word *local_4268;
  Builder local_4260;
  Builder local_4238;
  SegmentInit init;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  word buffer [2048];
  
  memset(buffer,0,0x4000);
  firstSegment.size_ = 0x800;
  firstSegment.ptr = buffer;
  MallocMessageBuilder::MallocMessageBuilder(&builder,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_4238,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_4238._builder.capTable;
  builder_00._builder.segment = local_4238._builder.segment;
  builder_00._builder.data = local_4238._builder.data;
  builder_00._builder.pointers = local_4238._builder.pointers;
  builder_00._builder.dataSize = local_4238._builder.dataSize;
  builder_00._builder.pointerCount = local_4238._builder.pointerCount;
  builder_00._builder._38_2_ = local_4238._builder._38_2_;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  pAVar2 = AVar3.ptr;
  if ((SegmentBuilder *)AVar3.size_ != (SegmentBuilder *)0x1) {
    init.space.ptr = (word *)CONCAT44(init.space.ptr._4_4_,1);
    local_42a8._builder.segment = (SegmentBuilder *)AVar3.size_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              ((Fault *)&builder2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x83,FAILED,"(1) == (segs.size())","1, segs.size()",(int *)&init,
               (unsigned_long *)&local_42a8);
    kj::_::Debug::Fault::fatal((Fault *)&builder2);
  }
  if (pAVar2->ptr == buffer) {
    init.space.size_ = 0x800;
    init.wordsUsed = pAVar2->size_;
    segments.size_ = 1;
    segments.ptr = &init;
    init.space.ptr = buffer;
    TestInitMessageBuilder::TestInitMessageBuilder(&builder2,segments);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_4260,&builder2.super_MessageBuilder);
    builder_01._builder.capTable = local_4260._builder.capTable;
    builder_01._builder.segment = local_4260._builder.segment;
    builder_01._builder.data = local_4260._builder.data;
    builder_01._builder.pointers = local_4260._builder.pointers;
    builder_01._builder.dataSize = local_4260._builder.dataSize;
    builder_01._builder.pointerCount = local_4260._builder.pointerCount;
    builder_01._builder._38_2_ = local_4260._builder._38_2_;
    checkTestMessage(builder_01);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_42a8,&builder2.super_MessageBuilder);
    *(undefined8 *)((long)local_42a8._builder.data + 8) = 0x1e1b9;
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_42a8,&builder.super_MessageBuilder);
    if (*(long *)((long)local_42a8._builder.data + 8) != 0x1e1b9 && kj::_::Debug::minSeverity < 3) {
      local_42b0 = (word *)CONCAT44(local_42b0._4_4_,0x1e1b9);
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                (&local_42a8,&builder.super_MessageBuilder);
      local_4280._0_8_ = *(ulong *)((long)local_42a8._builder.data + 8);
      kj::_::Debug::log<char_const(&)[79],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x8e,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 (int *)&local_42b0,(long *)&local_4280);
    }
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_42a8._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      local_4280._0_8_ = local_4280._0_8_ & 0xffffffff00000000;
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x92,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                 (int *)&local_4280,(unsigned_long *)&local_42a8);
    }
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_42a8,&builder2.super_MessageBuilder);
    value.super_StringPtr.content.size_ = 10;
    value.super_StringPtr.content.ptr = "foobarbaz";
    capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_42a8,value);
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_42a8._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      local_4280._0_8_ = local_4280._0_8_ & 0xffffffff00000000;
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                 (int *)&local_4280,(unsigned_long *)&local_42a8);
    }
    sVar1 = pAVar2->size_;
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_42a8,&builder2.super_MessageBuilder);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_4280,&local_42a8);
    if ((buffer + sVar1 != (word *)local_4280.content.ptr) && (kj::_::Debug::minSeverity < 3)) {
      local_42b0 = buffer + pAVar2->size_;
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                (&local_42a8,&builder2.super_MessageBuilder);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_4280,&local_42a8);
      local_4268 = (word *)local_4280.content.ptr;
      kj::_::Debug::log<char_const(&)[154],void*,void*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x97,ERROR,
                 "\"failed: expected \" \"(kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))\", kj::implicitCast<void*>(buffer + segs[0].size()), kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin())"
                 ,(char (*) [154])
                  "failed: expected (kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))"
                 ,&local_42b0,&local_4268);
    }
    TestInitMessageBuilder::~TestInitMessageBuilder(&builder2);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&builder2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
             ,0x84,FAILED,"segs[0].begin() == buffer","");
  kj::_::Debug::Fault::fatal((Fault *)&builder2);
}

Assistant:

TEST(Message, MessageBuilderInitSpaceAvailable) {
  word buffer[2048];
  memset(buffer, 0, sizeof(buffer));
  MallocMessageBuilder builder(buffer);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Find out how much space in `buffer` was used in order to use in initializing the new message.
  auto segs = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segs.size());
  KJ_ASSERT(segs[0].begin() == buffer);

  MessageBuilder::SegmentInit init = { kj::ArrayPtr<word>(buffer), segs[0].size() };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(kj::arrayPtr(&init, 1));
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Ask builder2 to allocate new space. It should go into the free space at the end of the
  // segment.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(0, builder2.allocations.size());

  EXPECT_EQ(kj::implicitCast<void*>(buffer + segs[0].size()),
            kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()));
}